

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

void am_check_start_obj_parameters
               (Am_Object *in_cmd,Am_Value_List *placeholder_list,
               Am_Value_List *created_objects_assoc,int *cnt)

{
  Am_Am_Slot_Key slot;
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Wrapper *value;
  Am_Am_Slot_Key local_8a;
  Am_Object start_object;
  Am_Value v;
  Am_Value_List slots_modified;
  Am_Value_List slots_to_save;
  
  pAVar2 = Am_Object::Get(in_cmd,0x11a,0);
  Am_Object::Am_Object(&start_object,pAVar2);
  bVar1 = Am_Object::Valid(&start_object);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&start_object,0xb8,0);
    Am_Value_List::Am_Value_List(&slots_to_save,pAVar2);
    Am_Value_List::Am_Value_List(&slots_modified);
    v.type = 0;
    v.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Value_List::Start(&slots_to_save);
    while( true ) {
      bVar1 = Am_Value_List::Last(&slots_to_save);
      if (bVar1) break;
      pAVar2 = Am_Value_List::Get(&slots_to_save);
      Am_Am_Slot_Key::Am_Am_Slot_Key(&local_8a,pAVar2);
      slot.value = local_8a.value;
      pAVar2 = Am_Object::Get(&start_object,local_8a.value,1);
      Am_Value::operator=(&v,pAVar2);
      bVar1 = Am_Value::Valid(&v);
      if (bVar1 && v.type == 0xa001) {
        if (am_sdebug == true) {
          poVar3 = std::operator<<((ostream *)&std::cout,"checking slot ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,slot.value);
          poVar3 = std::operator<<(poVar3," oldval ");
          poVar3 = operator<<(poVar3,&v);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::ostream::flush();
        }
        bVar1 = check_one_obj_modified
                          (&v,slot.value,in_cmd,placeholder_list,created_objects_assoc,cnt);
        if (bVar1) {
          Am_Value_List::Add(&slots_modified,(uint)slot.value,Am_TAIL,true);
        }
      }
      Am_Value_List::Next(&slots_to_save);
    }
    bVar1 = Am_Value_List::Valid(&slots_modified);
    if (bVar1) {
      value = Am_Value_List::operator_cast_to_Am_Wrapper_(&slots_modified);
      Am_Object::Set(in_cmd,0xb8,value,1);
    }
    Am_Value::~Am_Value(&v);
    Am_Value_List::~Am_Value_List(&slots_modified);
    Am_Value_List::~Am_Value_List(&slots_to_save);
  }
  Am_Object::~Am_Object(&start_object);
  return;
}

Assistant:

void
am_check_start_obj_parameters(Am_Object &in_cmd,
                              Am_Value_List &placeholder_list,
                              Am_Value_List &created_objects_assoc, int &cnt)
{
  Am_Object start_object = in_cmd.Get(Am_START_OBJECT);
  if (start_object.Valid()) {
    Am_Value_List slots_to_save = start_object.Get(Am_SLOTS_TO_SAVE);
    Am_Value_List slots_modified;
    Am_Slot_Key slot;
    Am_Value v;
    for (slots_to_save.Start(); !slots_to_save.Last(); slots_to_save.Next()) {
      slot = (Am_Am_Slot_Key)slots_to_save.Get();
      v = start_object.Peek(slot);
      // **** should probably also check for lists of objects
      if (v.Valid() && v.type == Am_OBJECT) {
        if (am_sdebug)
          std::cout << "checking slot " << slot << " oldval " << v << std::endl
                    << std::flush;
        if (check_one_obj_modified(v, slot, in_cmd, placeholder_list,
                                   created_objects_assoc, cnt))
          slots_modified.Add(slot);
      }
    }
    if (slots_modified.Valid()) {
      in_cmd.Set(Am_SLOTS_TO_SAVE, slots_modified, Am_OK_IF_NOT_THERE);
    }
  }
}